

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseObjectMid
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  _Elt_pointer pPVar1;
  StringPiece message;
  StringPiece message_00;
  ParseType local_1c;
  
  if (type == END_OBJECT) {
    Advance(this);
    (*this->ow_->_vptr_ObjectWriter[3])();
    this->recursion_depth_ = this->recursion_depth_ + -1;
  }
  else {
    if (type != VALUE_SEPARATOR) {
      if (type == UNKNOWN) {
        message.length_ = 0x25;
        message.ptr_ = "Expected , or } after key:value pair.";
        ReportUnknown(__return_storage_ptr__,this,message);
        return __return_storage_ptr__;
      }
      message_00.length_ = 0x25;
      message_00.ptr_ = "Expected , or } after key:value pair.";
      ReportFailure(__return_storage_ptr__,this,message_00);
      return __return_storage_ptr__;
    }
    Advance(this);
    local_1c = ENTRY;
    pPVar1 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pPVar1 == (this->stack_).c.
                  super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_1c);
    }
    else {
      *pPVar1 = ENTRY;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar1 + 1;
    }
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseObjectMid(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected , or } after key:value pair.");
  }

  // Object is complete, advance past the comma and render the EndObject.
  if (type == END_OBJECT) {
    Advance();
    ow_->EndObject();
    --recursion_depth_;
    return util::Status();
  }
  // Found a comma, advance past it and get ready for an entry.
  if (type == VALUE_SEPARATOR) {
    Advance();
    stack_.push(ENTRY);
    return util::Status();
  }
  // Illegal token after key:value pair.
  return ReportFailure("Expected , or } after key:value pair.");
}